

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O3

char16 * __thiscall
Js::FunctionProxy::GetDebugNumberSet(FunctionProxy *this,wchar (*bufferToWriteTo) [42])

{
  uint uVar1;
  code *pcVar2;
  bool bVar3;
  int iVar4;
  undefined4 *puVar5;
  FunctionInfo *pFVar6;
  
  pFVar6 = (this->functionInfo).ptr;
  uVar1 = ((((((this->m_utf8SourceInfo).ptr)->m_srcInfo).ptr)->sourceContextInfo).ptr)->
          sourceContextId;
  if (pFVar6 == (FunctionInfo *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                                ,0x4c1,"(GetFunctionInfo())","GetFunctionInfo()");
    if (!bVar3) goto LAB_00759501;
    *puVar5 = 0;
    pFVar6 = (this->functionInfo).ptr;
  }
  iVar4 = swprintf_s((char16_t_conflict *)bufferToWriteTo,0x2a,
                     (char16_t_conflict *)L" (#%d.%u), #%u",(ulong)uVar1,(ulong)pFVar6->functionId,
                     (ulong)this->m_functionNumber);
  if (iVar4 < 9) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                ,0xa1,"(len > 8)","len > 8");
    if (!bVar3) {
LAB_00759501:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar5 = 0;
  }
  return *bufferToWriteTo;
}

Assistant:

char16* FunctionProxy::GetDebugNumberSet(wchar(&bufferToWriteTo)[MAX_FUNCTION_BODY_DEBUG_STRING_SIZE]) const
    {
        // (#%u.%u), #%u --> (source file Id . function Id) , function Number
        int len = swprintf_s(bufferToWriteTo, MAX_FUNCTION_BODY_DEBUG_STRING_SIZE, _u(" (#%d.%u), #%u"),
            (int)this->GetSourceContextId(), this->GetLocalFunctionId(), this->GetFunctionNumber());
        Assert(len > 8);
        return bufferToWriteTo;
    }